

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::utp_socket_impl::incoming
          (utp_socket_impl *this,uint8_t *buf,int size,packet_ptr *p,time_point param_4)

{
  difference_type *pdVar1;
  long lVar2;
  pointer psVar3;
  pointer __p;
  packet *ppVar4;
  int iVar5;
  size_t __n;
  _Head_base<0UL,_libtorrent::aux::packet_*,_false> local_48;
  vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_> *local_40;
  pointer local_38;
  
  if (0 < size) {
    local_40 = &this->m_read_buffer;
    while( true ) {
      psVar3 = (this->m_read_buffer).
               super__Vector_base<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar4 = (p->_M_t).
               super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
               super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl;
      if (psVar3 == (this->m_read_buffer).
                    super__Vector_base<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) break;
      if (ppVar4 != (packet *)0x0) {
        buf = ppVar4->buf + ppVar4->header_size;
      }
      iVar5 = size;
      if (psVar3->m_len < (long)size) {
        iVar5 = (int)psVar3->m_len;
      }
      __n = (size_t)iVar5;
      memcpy(psVar3->m_ptr,buf,__n);
      this->m_read = this->m_read + iVar5;
      psVar3->m_ptr = psVar3->m_ptr + __n;
      pdVar1 = &psVar3->m_len;
      *pdVar1 = *pdVar1 - __n;
      lVar2 = *pdVar1;
      this->m_read_buffer_size = this->m_read_buffer_size - iVar5;
      if (lVar2 == 0) {
        ::std::vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>::erase
                  (local_40,(local_40->
                            super__Vector_base<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
      }
      local_48._M_head_impl =
           (p->_M_t).super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>
           ._M_t.super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
           super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl;
      if (local_48._M_head_impl != (packet *)0x0) {
        (local_48._M_head_impl)->header_size = (local_48._M_head_impl)->header_size + (short)iVar5;
      }
      buf = buf + __n;
      size = size - iVar5;
      if (size == 0) {
        (p->_M_t).super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>.
        _M_t.super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
        super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl = (packet *)0x0;
        release_packet(this,(packet_ptr *)&local_48);
        free(local_48._M_head_impl);
        return;
      }
    }
    if (ppVar4 == (packet *)0x0) {
      acquire_packet((utp_socket_impl *)&stack0xffffffffffffffc8,(int)this);
      __p = local_38;
      local_38 = (pointer)0x0;
      ::std::__uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::reset
                ((__uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)p,__p)
      ;
      free(local_38);
      ppVar4 = (p->_M_t).
               super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
               super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl;
      ppVar4->size = (uint16_t)size;
      ppVar4->header_size = 0;
      memcpy(ppVar4->buf,buf,(long)size);
      ppVar4 = (p->_M_t).
               super___uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::packet_*,_libtorrent::aux::packet_deleter>.
               super__Head_base<0UL,_libtorrent::aux::packet_*,_false>._M_head_impl;
    }
    this->m_receive_buffer_size =
         this->m_receive_buffer_size + ((uint)ppVar4->size - (uint)ppVar4->header_size);
    ::std::
    vector<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>,std::allocator<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>>>
    ::emplace_back<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>>
              ((vector<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>,std::allocator<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>>>
                *)&this->m_receive_buffer,p);
  }
  return;
}

Assistant:

void utp_socket_impl::incoming(std::uint8_t const* buf, int size, packet_ptr p
	, time_point /* now */)
{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
	INVARIANT_CHECK;
#endif

	TORRENT_ASSERT(size >= 0);
	if (size <= 0) return;

	// if a packet, p, is passed in here, the buf argument is ignored, and size
	// is redundant, as it must match p->size
	TORRENT_ASSERT(!p || p->size - p->header_size == size);
	TORRENT_ASSERT(!p || !buf);

	while (!m_read_buffer.empty())
	{
		UTP_LOGV("%8p: incoming: have user buffer (%d)\n", static_cast<void*>(this), m_read_buffer_size);
		if (p)
		{
			buf = p->buf + p->header_size;
			TORRENT_ASSERT(p->size - p->header_size >= size);
		}
		iovec_t* target = &m_read_buffer.front();

		int const to_copy = static_cast<int>(std::min(std::ptrdiff_t(size), target->size()));
		TORRENT_ASSERT(to_copy >= 0);
		std::memcpy(target->data(), buf, std::size_t(to_copy));
		m_read += to_copy;
		*target = target->subspan(to_copy);
		buf += to_copy;
		TORRENT_ASSERT(m_read_buffer_size >= to_copy);
		m_read_buffer_size -= to_copy;
		size -= to_copy;
		UTP_LOGV("%8p: copied %d bytes into user receive buffer\n", static_cast<void*>(this), to_copy);
		if (target->size() == 0) m_read_buffer.erase(m_read_buffer.begin());
		if (p)
		{
			p->header_size += std::uint16_t(to_copy);
			TORRENT_ASSERT(p->header_size <= p->size);
		}

		if (size == 0)
		{
			TORRENT_ASSERT(!p || p->header_size == p->size);
			release_packet(std::move(p));
			return;
		}
	}

	TORRENT_ASSERT(m_read_buffer_size == 0);

	if (!p)
	{
		TORRENT_ASSERT(buf);
		p = acquire_packet(size);
		p->size = std::uint16_t(size);
		p->header_size = 0;
		std::memcpy(p->buf, buf, aux::numeric_cast<std::size_t>(size));
	}
	// save this packet until the client issues another read
	m_receive_buffer_size += p->size - p->header_size;
	m_receive_buffer.emplace_back(std::move(p));

	UTP_LOGV("%8p: incoming: saving packet in receive buffer (%d)\n", static_cast<void*>(this), m_receive_buffer_size);

#if TORRENT_USE_INVARIANT_CHECKS
	check_receive_buffers();
#endif
}